

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O3

size_t __thiscall YAML::detail::node_data::size(node_data *this)

{
  pointer ppnVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (this->m_isDefined != true) {
    return 0;
  }
  if (this->m_type == Map) {
    compute_map_size(this);
    uVar3 = ((long)(this->m_map).
                   super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_map).
                   super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) -
            (this->m_undefinedPairs).
            super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
            ._M_impl._M_node._M_size;
  }
  else if (this->m_type == Sequence) {
    ppnVar1 = (this->m_sequence).
              super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->m_sequence).
                  super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppnVar1 >> 3;
    uVar2 = this->m_seqSize;
    uVar3 = uVar2;
    if (uVar2 < uVar4) {
      do {
        if (**(char **)(ppnVar1[uVar2]->m_pRef).
                       super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != '\x01') {
          return uVar2;
        }
        uVar2 = uVar2 + 1;
        this->m_seqSize = uVar2;
        uVar3 = uVar4;
      } while (uVar4 != uVar2);
    }
  }
  else {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

std::size_t node_data::size() const {
  if (!m_isDefined)
    return 0;

  switch (m_type) {
    case NodeType::Sequence:
      compute_seq_size();
      return m_seqSize;
    case NodeType::Map:
      compute_map_size();
      return m_map.size() - m_undefinedPairs.size();
    default:
      return 0;
  }
  return 0;
}